

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O1

_Bool borg_best_stuff(void)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  borg_shop *pbVar4;
  _Bool _Var5;
  uint16_t uVar6;
  uint8_t *best;
  uint8_t *test;
  borg_best *p;
  borg_item_conflict *pbVar7;
  char *what;
  int16_t *piVar8;
  ulong uVar9;
  borg_item_conflict *pbVar10;
  int32_t value;
  int32_t local_34;
  
  if (shop_num == 7) {
    if (borg.goal.do_best) {
      _Var5 = borg_home_full();
      if (((_Var5) || (_Var5 = borg_inventory_full(), _Var5)) || (borg.goal.do_best != true))
      goto LAB_0022fddb;
      best = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      test = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      if (z_info->equip_slots_max != 0) {
        uVar9 = 0;
        do {
          test[uVar9] = 0xff;
          best[uVar9] = 0xff;
          uVar9 = uVar9 + 1;
        } while (uVar9 < z_info->equip_slots_max);
      }
      local_34 = borg.power;
      bVar3 = false;
      borg_best_stuff_aux(0,test,best,&local_34);
      borg_notice(true);
      p = (borg_best *)mem_zalloc((ulong)((uint)z_info->equip_slots_max * 2) * 3);
      pbVar4 = borg_shops;
      pbVar10 = borg_items;
      uVar2 = z_info->equip_slots_max;
      borg.goal.best_item = p;
      if ((ulong)uVar2 != 0) {
        piVar8 = &p->pval;
        uVar9 = 0;
        bVar3 = false;
        do {
          bVar1 = best[uVar9];
          uVar6 = borg_best_stuff_order((int)uVar9);
          if ((bVar1 != 0xff) && (uVar6 != bVar1)) {
            if (bVar1 < 100) {
              pbVar7 = pbVar10 + bVar1;
            }
            else {
              pbVar7 = pbVar4[7].ware + ((ulong)bVar1 - 100);
              ((borg_best *)(piVar8 + -2))->home = true;
            }
            *(uint8_t *)((long)piVar8 + -3) = pbVar7->tval;
            *piVar8 = pbVar7->pval;
            *(uint8_t *)(piVar8 + -1) = pbVar7->sval;
            bVar3 = true;
          }
          uVar9 = uVar9 + 1;
          piVar8 = piVar8 + 3;
        } while (uVar2 != uVar9);
      }
      if ((!bVar3) && (p != (borg_best *)0x0)) {
        mem_free(p);
        borg.goal.best_item = (borg_best *)0x0;
      }
      borg.goal.do_best = false;
      if (*borg_cfg != 0) {
        if (bVar3) {
          if (z_info->equip_slots_max != 0) {
            uVar9 = 0;
            do {
              bVar1 = best[uVar9];
              if ((ulong)bVar1 < 0x65) {
                pbVar10 = borg_items + bVar1;
              }
              else {
                pbVar10 = borg_shops[7].ware + (bVar1 - 100);
              }
              what = format("new best: %s",pbVar10);
              borg_note(what);
              uVar9 = uVar9 + 1;
            } while (uVar9 < z_info->equip_slots_max);
          }
        }
        else {
          borg_note("new best: no changes");
        }
      }
      mem_free(best);
      mem_free(test);
    }
    _Var5 = borg_one_step_wearing_best(0);
  }
  else {
LAB_0022fddb:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool borg_best_stuff(void)
{
    int k;

    int32_t value;

    int i;

    uint8_t *test;
    uint8_t *best;

    /* only do this at home */
    if (shop_num != BORG_HOME)
        return false;

    /* if we don't need to do "best", check if we need to process the list */
    if (!borg.goal.do_best)
        return borg_one_step_wearing_best(0);

    /* must have a free inventory slot and a free home slot */
    if (borg_home_full() || borg_inventory_full())
        return false;

    /* only do this once per trip to town */
    if (!borg.goal.do_best)
        return false;

    best = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    test = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    /* Hack -- Initialize */
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Initialize */
        best[k] = test[k] = 255;
    }

    /* Evaluate the inventory */
    value = borg.power;

    /* Determine the best possible equipment */
    (void)borg_best_stuff_aux(0, test, best, &value);

    /* Restore bonuses */
    borg_notice(true);

    /* convert the list into a list of items we can find even if they */
    /* change locations due to picking up and dropping items */
    /* Make first change. */
    borg_item *item;
    borg.goal.best_item
        = mem_zalloc(sizeof(struct borg_best) * z_info->equip_slots_max);
    bool found = false;
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Get choice */
        i = best[k];

        /* Ignore non-changes */
        if (i == borg_best_stuff_order(k) || 255 == i)
            continue;

        found = true;
        if (i < 100) {
            item = &borg_items[i];
        } else {
            item = &borg_shops[BORG_HOME].ware[i - 100];
            borg.goal.best_item[k].home = true;
        }

        /* hopefully this is enough to get a unique item */
        borg.goal.best_item[k].tval = item->tval;
        borg.goal.best_item[k].pval = item->pval;
        borg.goal.best_item[k].sval = item->sval;
    }
    /* if we didn't change anything, clear out the changes */
    if (!found)
        borg_clear_best();

    /* we have done our best optimization.  */
    borg.goal.do_best = false;

    /* if we are being super chatty, spit out the new list of best */
    if (borg_cfg[BORG_VERBOSE]) {
        if (found) {
            for (i = 0; i < z_info->equip_slots_max; i++) {
                if (best[i] > 100) {
                    borg_note(format("new best: %s",
                        borg_shops[BORG_HOME].ware[best[i] - 100].desc));
                } else {
                    borg_note(format("new best: %s", borg_items[best[i]].desc));
                }
            }
        } else {
            borg_note("new best: no changes");
        }
    }
    mem_free(best);
    best = NULL;
    mem_free(test);
    test = NULL;

    return borg_one_step_wearing_best(0);
}